

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [41],unsigned_long *params_1,
          char (*params_2) [9],char **params_3,char *params_4)

{
  FixedArray<char,_1UL> *in_stack_ffffffffffffff68;
  undefined1 local_89;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  CappedArray<char,_26UL> local_58;
  
  local_68 = toCharSequence<char_const(&)[41]>((char (*) [41])this);
  toCharSequence<unsigned_long>(&local_58,(unsigned_long *)params);
  local_78 = toCharSequence<char_const(&)[9]>((char (*) [9])params_1);
  local_88 = toCharSequence<char_const*&>((char **)params_2);
  local_89 = *(undefined1 *)params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_68,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_26UL> *)&local_78,&local_88,(ArrayPtr<const_char> *)&local_89,
             in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}